

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

GraphicsPipelineDesc * __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this)

{
  GraphicsPipelineData *pGVar1;
  char (*in_RCX) [37];
  string msg;
  string local_30;
  
  CheckPipelineReady(this);
  if (((this->
       super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
       ).m_Desc.PipelineType & ~PIPELINE_TYPE_MESH) != PIPELINE_TYPE_GRAPHICS) {
    FormatString<char[26],char[37]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_Desc.IsAnyGraphicsPipeline()",in_RCX);
    in_RCX = (char (*) [37])0x20c;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetGraphicsPipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x20c);
    std::__cxx11::string::~string((string *)&local_30);
  }
  pGVar1 = (this->field_6).m_pGraphicsPipelineData;
  if (pGVar1 == (GraphicsPipelineData *)0x0) {
    FormatString<char[26],char[35]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pGraphicsPipelineData != nullptr",(char (*) [35])in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetGraphicsPipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x20d);
    std::__cxx11::string::~string((string *)&local_30);
    pGVar1 = (this->field_6).m_pGraphicsPipelineData;
  }
  return &pGVar1->Desc;
}

Assistant:

GetGraphicsPipelineDesc() const override final
    {
        CheckPipelineReady();
        VERIFY_EXPR(this->m_Desc.IsAnyGraphicsPipeline());
        VERIFY_EXPR(m_pGraphicsPipelineData != nullptr);
        return m_pGraphicsPipelineData->Desc;
    }